

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool loadfirstvalue(roaring_uint32_iterator_t *newit)

{
  _Bool _Var1;
  roaring_container_iterator_t rVar2;
  ulong in_RAX;
  uint16_t value;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  _Var1 = iter_new_container_partial_init(newit);
  if (_Var1) {
    uStack_18 = uStack_18 & 0xffffffffffff;
    rVar2 = container_init_iterator
                      (newit->container,newit->typecode,(uint16_t *)((long)&uStack_18 + 6));
    (newit->container_it).index = rVar2.index;
    newit->current_value = (uint)uStack_18._6_2_ | newit->highbits;
  }
  return newit->has_value;
}

Assistant:

CROARING_WARN_UNUSED static bool loadfirstvalue(
    roaring_uint32_iterator_t *newit) {
    if (iter_new_container_partial_init(newit)) {
        uint16_t value = 0;
        newit->container_it =
            container_init_iterator(newit->container, newit->typecode, &value);
        newit->current_value = newit->highbits | value;
    }
    return newit->has_value;
}